

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

void __thiscall cmFileAPI::ReadClientQuery(cmFileAPI *this,string *client,ClientQueryJson *q)

{
  bool bVar1;
  Value *pVVar2;
  Value query;
  string queryFile;
  Value local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ClientRequests local_a8;
  Value local_70;
  Value local_48;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                 &this->APIv1,"/query/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                 client);
  std::operator+(&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                 "/query.json");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_f0);
  Json::Value::Value(&local_f0,nullValue);
  bVar1 = ReadJsonFile(this,&local_c8,&local_f0,&q->Error);
  if (bVar1) {
    bVar1 = Json::Value::isObject(&local_f0);
    if (bVar1) {
      pVVar2 = Json::Value::operator[](&local_f0,"client");
      bVar1 = Json::Value::isNull(pVVar2);
      if (!bVar1) {
        Json::Value::Value(&local_48,pVVar2);
        Json::Value::operator=(&q->ClientValue,&local_48);
        Json::Value::~Value(&local_48);
      }
      pVVar2 = Json::Value::operator[](&local_f0,"requests");
      Json::Value::Value(&local_70,pVVar2);
      Json::Value::operator=(&q->RequestsValue,&local_70);
      Json::Value::~Value(&local_70);
      BuildClientRequests(&local_a8,this,&q->RequestsValue);
      ClientRequests::operator=(&q->Requests,&local_a8);
      ClientRequests::~ClientRequests(&local_a8);
    }
    else {
      std::__cxx11::string::assign((char *)q);
    }
  }
  Json::Value::~Value(&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void cmFileAPI::ReadClientQuery(std::string const& client, ClientQueryJson& q)
{
  // Read the query.json file.
  std::string queryFile = this->APIv1 + "/query/" + client + "/query.json";
  Json::Value query;
  if (!this->ReadJsonFile(queryFile, query, q.Error)) {
    return;
  }
  if (!query.isObject()) {
    q.Error = "query root is not an object";
    return;
  }

  Json::Value const& clientValue = query["client"];
  if (!clientValue.isNull()) {
    q.ClientValue = clientValue;
  }
  q.RequestsValue = std::move(query["requests"]);
  q.Requests = this->BuildClientRequests(q.RequestsValue);
}